

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O1

string * __thiscall
phosg::name_for_pid_abi_cxx11_(string *__return_storage_ptr__,phosg *this,pid_t pid)

{
  int iVar1;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  string command;
  allocator<char> local_91;
  code *local_90;
  FILE *local_88;
  string local_80;
  string local_60;
  string local_40;
  
  string_printf_abi_cxx11_
            (&local_40,"ps -ax -c -o pid -o command | grep ^\\ *%u\\ | sed s/[0-9]*\\ //g",
             (ulong)this & 0xffffffff);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,local_40._M_dataplus._M_p,&local_91);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"r","");
  popen_unique((phosg *)&local_90,&local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    iVar1 = fgetc(local_88);
    if (iVar1 == -1) break;
    if (iVar1 - 0x20U < 0x5f) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,(char)iVar1);
    }
  }
  if (local_88 != (FILE *)0x0) {
    (*local_90)(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string name_for_pid(pid_t pid) {
  string command = string_printf("ps -ax -c -o pid -o command | grep ^\\ *%u\\ | sed s/[0-9]*\\ //g", pid);
  auto f = popen_unique(command.c_str(), "r");

  string name;

  int ch;
  while ((ch = fgetc(f.get())) != EOF) {
    if (ch >= 0x20 && ch < 0x7F) {
      name += ch;
    }
  }

  return name;
}